

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_8.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  undefined4 uStack_38;
  int n;
  
  _uStack_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,&n);
  num[0] = n;
  lVar7 = 1;
  iVar3 = n;
  while( true ) {
    bVar2 = judge(iVar3);
    if (bVar2) break;
    iVar1 = n;
    iVar3 = reset(n);
    iVar3 = iVar3 + iVar1;
    _uStack_38 = CONCAT44(iVar3,uStack_38);
    num[lVar7] = iVar3;
    lVar7 = lVar7 + 1;
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar7 + -1);
  std::endl<char,std::char_traits<char>>(poVar4);
  piVar6 = num;
  lVar5 = lVar7;
  while( true ) {
    bVar2 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar2) break;
    if (lVar5 == 0) {
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar7 * 4 + 0x10407c));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar6);
      std::operator<<(poVar4,"--->");
    }
    piVar6 = piVar6 + 1;
  }
  return 0;
}

Assistant:

int main()
{
    int n,cnt = 0;  //cnt来记录转换加了多少次
    cin  >> n;
    num[cnt++] = n;     //先把这个数存在num当中
    while (!judge(n))
    {
        n += reset(n);
        num[cnt++] = n;
    }
    cout << cnt -1 <<endl;  //cnt-1,要排除这个数本身，才是转换的次数
    for (int i = 0; i < cnt; ++i) {
        if(i != cnt-1 )
        {
            cout << num[i] << "--->";
        }else
            cout << num[i] <<endl;
    }
    return 0;
}